

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O2

int Cudd_ReadLinear(DdManager *table,int x,int y)

{
  if (table->size == table->linearSize) {
    return (int)(((ulong)table->linear[(y >> 6) + ((table->size + -1 >> 6) + 1) * x] >>
                  ((ulong)(uint)y & 0x3f) & 1) != 0);
  }
  __assert_fail("table->size == table->linearSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddLinear.c"
                ,0xca,"int Cudd_ReadLinear(DdManager *, int, int)");
}

Assistant:

int
Cudd_ReadLinear(
  DdManager * table /* CUDD manager */,
  int  x /* row index */,
  int  y /* column index */)
{
    int nvars = table->size;
    int wordsPerRow = ((nvars - 1) >> LOGBPL) + 1;
    long word;
    int bit;
    int result;

    assert(table->size == table->linearSize);

    word = wordsPerRow * x + (y >> LOGBPL);
    bit  = y & (BPL-1);
    result = (int) ((table->linear[word] >> bit) & 1);
    return(result);

}